

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_InvalidSegmentType_Test::TestBody(NLReaderTest_InvalidSegmentType_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  bool in_stack_00000187;
  string *in_stack_00000188;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffdd0;
  char in_stack_fffffffffffffdd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdec;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  Type in_stack_fffffffffffffdfc;
  AssertionResult *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffe48;
  AssertHelper *in_stack_fffffffffffffe50;
  undefined1 local_151 [33];
  string local_130 [32];
  string local_110 [38];
  byte local_ea;
  undefined1 local_e9 [33];
  AssertionResult local_c8 [3];
  int local_98;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [38];
  byte local_4a;
  allocator<char> local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe10,
               (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               (allocator<char> *)in_stack_fffffffffffffe00);
    std::allocator<char>::~allocator(&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,
                 (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 (allocator<char> *)in_stack_fffffffffffffe00);
      ReadNL(in_stack_00000188,in_stack_00000187);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffe00,
                 (char (*) [90])CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      local_98 = 2;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_98 != 0) goto LAB_0016e577;
  }
  else {
LAB_0016e577:
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    testing::AssertionResult::failure_message((AssertionResult *)0x16e593);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    testing::Message::~Message((Message *)0x16e5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16e648);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               (allocator<char> *)in_stack_fffffffffffffe00);
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
    local_ea = 0;
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      in_stack_fffffffffffffe00 = (AssertionResult *)local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe08),
                 (allocator<char> *)in_stack_fffffffffffffe00);
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd7);
      ReadNL(in_stack_00000188,in_stack_00000187);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string((string *)(local_151 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_151);
    }
    if ((local_ea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffe00,
                 (char (*) [119])CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      local_98 = 3;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    if (local_98 == 0) goto LAB_0016eb3a;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe00);
  testing::AssertionResult::failure_message((AssertionResult *)0x16ea97);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  testing::Message::~Message((Message *)0x16eaf2);
LAB_0016eb3a:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16eb47);
  return;
}

Assistant:

TEST(NLReaderTest, InvalidSegmentType) {
  EXPECT_READ_ERROR("?", "(input):17:1: invalid segment type");
  EXPECT_READ_ERROR(std::string("C0\nn4.2\n") + '\0',
                    "(input):19:1: invalid segment type");
}